

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack3_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 7;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 3 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 6 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 9 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *in >> 0xc & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *in >> 0xf & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *in >> 0x12 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *in >> 0x15 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = *in >> 0x18 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *in >> 0x1b & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 1) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 1 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 4 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 7 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 10 & 7;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 0xd & 7;
  *puVar1 = base + *puVar1;
  return in + 2;
}

Assistant:

uint32_t * unpack3_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  15  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 3 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 3 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 3 )  ;
    *out += base;
    out++;

    return in + 1;
}